

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5StorageDelete(Fts5Storage *p,i64 iDel,sqlite3_value **apVal,int bSaveRow)

{
  long *plVar1;
  int *pRc;
  u8 uVar2;
  Fts5Config *pFVar3;
  Fts5Config *pConfig;
  Fts5Index *p_00;
  Fts5StructureSegment *pFVar4;
  u8 *puVar5;
  Fts5Storage *pStmt;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  u32 uVar10;
  int iVar11;
  ulong uVar12;
  sqlite3_value *pVal;
  uchar *pText;
  uchar *puVar13;
  Fts5Structure *pStruct;
  Fts5Data **ap;
  Fts5Data *pFVar14;
  Fts5Data *p_01;
  u64 iRowid;
  ulong uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  sqlite3_stmt *psVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long in_FS_OFFSET;
  bool bVar28;
  Fts5Data *local_100;
  ulong local_c0;
  sqlite3_stmt *pDel;
  int local_6c;
  uchar *local_68;
  int local_5c;
  uchar *local_58;
  Fts5Storage *local_50;
  undefined8 local_48;
  sqlite3_stmt *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar3 = p->pConfig;
  pDel = (sqlite3_stmt *)0x0;
  uVar6 = fts5StorageLoadTotals(p,1);
  if ((uVar6 != 0) || (uVar6 = sqlite3Fts5IndexBeginWrite(p->pIndex,1,iDel), uVar6 != 0))
  goto LAB_001d0757;
  pConfig = p->pConfig;
  if (pConfig->bContentlessDelete == 0) {
    local_40 = (sqlite3_stmt *)0x0;
    uVar8 = 0;
    local_48 = 0xaaaaaaaaffffffff;
    if (apVal == (sqlite3_value **)0x0) {
      psVar21 = p->pSavedRow;
      if (bSaveRow == 0 || psVar21 == (sqlite3_stmt *)0x0) {
        uVar6 = fts5StorageGetStmt(p,bSaveRow + 2,&local_40,(char **)0x0);
        psVar21 = local_40;
        if (uVar6 == 0) {
          sqlite3_bind_int64(local_40,1,iDel);
          iVar7 = sqlite3_step(psVar21);
          if (iVar7 == 100) goto LAB_001d089b;
          uVar6 = sqlite3_reset(psVar21);
        }
        goto LAB_001d10ce;
      }
      p->pSavedRow = (sqlite3_stmt *)0x0;
    }
    else {
      psVar21 = (sqlite3_stmt *)0x0;
    }
LAB_001d089b:
    lVar25 = 1;
    local_50 = p;
    while (bVar28 = uVar8 == 0, bVar28) {
      if (pConfig->nCol < lVar25) {
        lVar25 = p->nTotalRow;
        if (0 < lVar25) goto LAB_001d0a81;
        uVar8 = 0x10b;
        bVar28 = false;
        goto LAB_001d10bb;
      }
      uVar8 = 0;
      if (pConfig->abUnindexed[lVar25 + -1] == '\0') {
        local_58 = (uchar *)0x0;
        local_5c = 0;
        local_68 = (uchar *)0x0;
        local_6c = 0;
        iVar7 = (int)lVar25;
        if (psVar21 == (sqlite3_stmt *)0x0) {
          pVal = apVal[lVar25 + -1];
        }
        else {
          pVal = sqlite3_column_value(psVar21,iVar7);
        }
        if ((pConfig->bLocale == 0) ||
           (iVar16 = sqlite3Fts5IsLocaleValue(pConfig,pVal), iVar16 == 0)) {
          pText = sqlite3_value_text(pVal);
          iVar16 = sqlite3_value_bytes(pVal);
          if ((psVar21 == (sqlite3_stmt *)0x0) || (pConfig->bLocale == 0)) {
            puVar13 = (uchar *)0x0;
            iVar7 = 0;
          }
          else {
            puVar13 = sqlite3_column_text(psVar21,pConfig->nCol + iVar7);
            iVar7 = sqlite3_column_bytes(psVar21,pConfig->nCol + iVar7);
          }
        }
        else {
          uVar8 = sqlite3Fts5DecodeLocaleValue
                            (pVal,(char **)&local_58,&local_5c,(char **)&local_68,&local_6c);
          pText = local_58;
          puVar13 = local_68;
          iVar7 = local_6c;
          iVar16 = local_5c;
          if (uVar8 != 0) goto LAB_001d0a5c;
        }
        (pConfig->t).pLocale = (char *)puVar13;
        (pConfig->t).nLocale = iVar7;
        local_48 = local_48 & 0xffffffff;
        uVar6 = sqlite3Fts5Tokenize(pConfig,4,(char *)pText,iVar16,&local_50,
                                    fts5StorageInsertCallback);
        lVar27 = p->aTotalSize[lVar25 + -1] - (long)local_48._4_4_;
        p->aTotalSize[lVar25 + -1] = lVar27;
        uVar8 = (uint)(lVar27 >> 0x3f) & 0x10b;
        if (uVar6 != 0) {
          uVar8 = uVar6;
        }
        (pConfig->t).pLocale = (char *)0x0;
        (pConfig->t).nLocale = 0;
      }
LAB_001d0a5c:
      lVar25 = lVar25 + 1;
    }
    lVar25 = p->nTotalRow;
LAB_001d0a81:
    p->nTotalRow = lVar25 + -1;
    if ((bSaveRow == 0) || (uVar8 != 0)) {
LAB_001d10bb:
      uVar6 = sqlite3_reset(psVar21);
      if (!bVar28) {
        uVar6 = uVar8;
      }
    }
    else {
      p->pSavedRow = psVar21;
      uVar6 = 0;
    }
    goto LAB_001d10ce;
  }
  local_50 = (Fts5Storage *)0x0;
  uVar6 = fts5StorageGetStmt(p,9,(sqlite3_stmt **)&local_50,(char **)0x0);
  pStmt = local_50;
  if (uVar6 != 0) goto LAB_001d0757;
  sqlite3_bind_int64((sqlite3_stmt *)local_50,1,iDel);
  iVar7 = sqlite3_step((sqlite3_stmt *)pStmt);
  if (iVar7 == 100) {
    uVar12 = sqlite3_column_int64((sqlite3_stmt *)pStmt,1);
  }
  else {
    uVar12 = 0;
  }
  uVar6 = sqlite3_reset((sqlite3_stmt *)pStmt);
  if (uVar12 != 0 && uVar6 == 0) {
    p_00 = p->pIndex;
    pStruct = fts5StructureRead(p_00);
    if (pStruct != (Fts5Structure *)0x0) {
      pRc = &p_00->rc;
      bVar28 = false;
      uVar24 = (ulong)(uint)pStruct->nLevel;
LAB_001d0b1b:
      uVar18 = uVar24;
      if (0 < (int)uVar18) {
        uVar19 = (ulong)(uint)pStruct->aLevel[uVar18 - 1].nSeg;
LAB_001d0b3d:
        uVar20 = uVar19 & 0xffffffff;
        lVar25 = uVar19 * 0x38 + -0x10;
        while( true ) {
          uVar19 = uVar19 - 1;
          uVar24 = uVar18 - 1;
          if ((int)uVar20 < 1) goto LAB_001d0b1b;
          pFVar4 = pStruct->aLevel[uVar18 - 1].aSeg;
          if ((*(ulong *)((long)pFVar4 + lVar25 + -0x18) <= uVar12) &&
             (uVar12 <= *(ulong *)((long)pFVar4 + lVar25 + -0x10))) break;
          uVar20 = (ulong)((int)uVar20 - 1);
          lVar25 = lVar25 + -0x38;
        }
        if (!bVar28) {
          plVar1 = (long *)((long)&pFVar4->iSegid + lVar25);
          *plVar1 = *plVar1 + 1;
        }
        p_00->nContentlessDelete = p_00->nContentlessDelete + 1;
        iVar7 = *(int *)((long)pFVar4 + lVar25 + -8);
        if (0 < (long)iVar7) goto code_r0x001d0b9a;
        local_c0 = 0xffffffff;
        local_100 = (Fts5Data *)0x0;
        iVar16 = 4;
        goto LAB_001d0c3c;
      }
      fts5StructureRelease(pStruct);
    }
    uVar6 = p_00->rc;
    p_00->rc = 0;
  }
  if ((bSaveRow == 0) || (uVar6 != 0)) {
LAB_001d10ce:
    if (uVar6 != 0) goto LAB_001d0757;
  }
  else if (p->pConfig->eContent == 3) {
    uVar6 = sqlite3Fts5StorageFindDeleteRow(p,iDel);
    goto LAB_001d10ce;
  }
  if (pFVar3->bColumnsize == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = fts5StorageGetStmt(p,8,&pDel,(char **)0x0);
    psVar21 = pDel;
    if (uVar6 == 0) {
      sqlite3_bind_int64(pDel,1,iDel);
      sqlite3_step(psVar21);
      uVar6 = sqlite3_reset(psVar21);
    }
  }
LAB_001d0757:
  iVar7 = pFVar3->eContent;
  if ((((iVar7 == 3) || (iVar7 == 0)) && (uVar6 == 0)) &&
     (uVar6 = fts5StorageGetStmt(p,6,&pDel,(char **)0x0), psVar21 = pDel, uVar6 == 0)) {
    sqlite3_bind_int64(pDel,1,iDel);
    sqlite3_step(psVar21);
    uVar6 = sqlite3_reset(psVar21);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar6;
code_r0x001d0b9a:
  local_c0 = (ulong)iDel % (ulong)(long)iVar7;
  local_100 = fts5DataRead(p_00,(ulong)(*(int *)((long)pFVar4 + lVar25 + -0x28) + 0x10000) << 0x25 |
                                local_c0);
  bVar28 = true;
  if (local_100 == (Fts5Data *)0x0) goto LAB_001d0b3d;
  iVar7 = fts5IndexTombstoneAddToPage(local_100,0,*(int *)((long)pFVar4 + lVar25 + -8),iDel);
  if (iVar7 == 0) {
    fts5DataWrite(p_00,(ulong)(*(int *)((long)pFVar4 + lVar25 + -0x28) + 0x10000) << 0x25 | local_c0
                  ,local_100->p,local_100->nn);
    sqlite3_free(local_100);
    goto LAB_001d0fde;
  }
  iVar16 = (uint)(*local_100->p != '\x04') * 4 + 4;
  iVar7 = *(int *)((long)pFVar4 + lVar25 + -8);
LAB_001d0c3c:
  if ((ulong)iDel >> 0x20 != 0) {
    iVar16 = 8;
  }
  iVar9 = (p_00->pConfig->pgsz + -8) / iVar16;
  if (iVar9 < 0x21) {
    iVar9 = 0x20;
  }
  uVar24 = 1;
  iVar17 = 0x20;
  if (iVar7 != 0) {
    if (iVar7 == 1) {
      uVar10 = fts5GetU32(local_100->p + 4);
      iVar11 = uVar10 * 4;
      iVar17 = 0x20;
      if (0x20 < iVar11) {
        iVar17 = iVar11;
      }
      uVar24 = 1;
      if (iVar11 <= iVar9) goto LAB_001d0cc3;
    }
    uVar24 = (ulong)(iVar7 * 2 + 1);
    iVar17 = iVar9;
  }
LAB_001d0cc3:
  while( true ) {
    iVar7 = (int)uVar24;
    uVar23 = (ulong)iVar7;
    ap = (Fts5Data **)sqlite3Fts5MallocZero(pRc,uVar23 * 8);
    uVar20 = 0;
    if (0 < iVar7) {
      uVar20 = uVar24;
    }
    for (uVar26 = 0; uVar20 != uVar26; uVar26 = uVar26 + 1) {
      pFVar14 = (Fts5Data *)sqlite3Fts5MallocZero(pRc,(ulong)(uint)(iVar17 * iVar16) + 0x18);
      if (pFVar14 != (Fts5Data *)0x0) {
        pFVar14->nn = iVar17 * iVar16 + 8;
        pFVar14->p = (u8 *)(pFVar14 + 1);
        ap[uVar26] = pFVar14;
      }
    }
    if (*pRc != 0) break;
    for (uVar26 = 0; uVar20 != uVar26; uVar26 = uVar26 + 1) {
      *ap[uVar26]->p = (u8)iVar16;
      puVar5 = ap[uVar26]->p;
      puVar5[4] = '\0';
      puVar5[5] = '\0';
      puVar5[6] = '\0';
      puVar5[7] = '\0';
    }
    uVar20 = 0;
    iVar17 = 0;
    while (iVar17 == 0) {
      if ((long)*(int *)((long)pFVar4 + lVar25 + -8) <= (long)uVar20) {
        if (*pRc == 0) {
          fts5IndexTombstoneAddToPage(ap[(ulong)iDel % uVar23],1,iVar7,iDel);
          uVar20 = 0;
          if (0 < iVar7) {
            uVar20 = uVar24;
          }
          for (uVar24 = 0; uVar20 != uVar24; uVar24 = uVar24 + 1) {
            fts5DataWrite(p_00,((ulong)(*(int *)((long)pFVar4 + lVar25 + -0x28) + 0x10000) << 0x25)
                               + uVar24,ap[uVar24]->p,ap[uVar24]->nn);
          }
          *(int *)((long)pFVar4 + lVar25 + -8) = iVar7;
          fts5StructureWrite(p_00,p_00->pStruct);
          goto LAB_001d0fc2;
        }
        goto LAB_001d0f12;
      }
      if (uVar20 == local_c0) {
        p_01 = (Fts5Data *)0x0;
        pFVar14 = local_100;
      }
      else {
        p_01 = fts5DataRead(p_00,((ulong)(*(int *)((long)pFVar4 + lVar25 + -0x28) + 0x10000) << 0x25
                                 ) + uVar20);
        pFVar14 = p_01;
      }
      if (pFVar14 == (Fts5Data *)0x0) {
        iVar17 = 0;
      }
      else {
        uVar2 = *pFVar14->p;
        uVar26 = (long)(pFVar14->nn + -8) / (long)(int)((uint)(uVar2 != '\x04') * 4 + 4);
        uVar15 = uVar26 & 0xffffffff;
        if ((int)uVar26 < 1) {
          uVar15 = 0;
        }
        lVar27 = 8;
        for (lVar22 = 0; uVar15 * 8 != lVar22; lVar22 = lVar22 + 8) {
          puVar5 = pFVar14->p;
          if (uVar2 == '\x04') {
            if (*(int *)(puVar5 + lVar27) != 0) {
              uVar10 = fts5GetU32(puVar5 + lVar27);
              iRowid = (u64)uVar10;
LAB_001d0e49:
              if ((iRowid != 0) &&
                 (iVar17 = fts5IndexTombstoneAddToPage(ap[iRowid % uVar23],0,iVar7,iRowid),
                 iVar17 != 0)) goto LAB_001d0e92;
            }
          }
          else if (*(long *)(puVar5 + lVar27 * 2 + -8) != 0) {
            iRowid = fts5GetU64(puVar5 + lVar22 + 8);
            goto LAB_001d0e49;
          }
          lVar27 = lVar27 + 4;
        }
        iVar17 = 0;
LAB_001d0e92:
        if (uVar20 == 0) {
          (*ap)->p[1] = pFVar14->p[1];
        }
      }
      sqlite3_free(p_01);
      uVar20 = uVar20 + 1;
    }
    fts5IndexFreeArray(ap,iVar7);
    uVar24 = (ulong)(iVar7 * 2 + 1);
    iVar17 = iVar9;
  }
LAB_001d0f12:
  fts5IndexFreeArray(ap,iVar7);
  ap = (Fts5Data **)0x0;
  iVar7 = 0;
LAB_001d0fc2:
  sqlite3_free(local_100);
  fts5IndexFreeArray(ap,iVar7);
LAB_001d0fde:
  bVar28 = true;
  goto LAB_001d0b3d;
}

Assistant:

static int sqlite3Fts5StorageDelete(
  Fts5Storage *p,                 /* Storage object */
  i64 iDel,                       /* Rowid to delete from table */
  sqlite3_value **apVal,          /* Optional - values to remove from index */
  int bSaveRow                    /* If true, set pSavedRow for deleted row */
){
  Fts5Config *pConfig = p->pConfig;
  int rc;
  sqlite3_stmt *pDel = 0;

  assert( pConfig->eContent!=FTS5_CONTENT_NORMAL || apVal==0 );
  rc = fts5StorageLoadTotals(p, 1);

  /* Delete the index records */
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5IndexBeginWrite(p->pIndex, 1, iDel);
  }

  if( rc==SQLITE_OK ){
    if( p->pConfig->bContentlessDelete ){
      rc = fts5StorageContentlessDelete(p, iDel);
      if( rc==SQLITE_OK
       && bSaveRow
       && p->pConfig->eContent==FTS5_CONTENT_UNINDEXED
      ){
        rc = sqlite3Fts5StorageFindDeleteRow(p, iDel);
      }
    }else{
      rc = fts5StorageDeleteFromIndex(p, iDel, apVal, bSaveRow);
    }
  }

  /* Delete the %_docsize record */
  if( rc==SQLITE_OK && pConfig->bColumnsize ){
    rc = fts5StorageGetStmt(p, FTS5_STMT_DELETE_DOCSIZE, &pDel, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pDel, 1, iDel);
      sqlite3_step(pDel);
      rc = sqlite3_reset(pDel);
    }
  }

  /* Delete the %_content record */
  if( pConfig->eContent==FTS5_CONTENT_NORMAL
   || pConfig->eContent==FTS5_CONTENT_UNINDEXED
  ){
    if( rc==SQLITE_OK ){
      rc = fts5StorageGetStmt(p, FTS5_STMT_DELETE_CONTENT, &pDel, 0);
    }
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pDel, 1, iDel);
      sqlite3_step(pDel);
      rc = sqlite3_reset(pDel);
    }
  }

  return rc;
}